

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessMemberTestSuite.cpp
# Opt level: O1

bool changeValueOfSimpleMember(void)

{
  int iVar1;
  Test t;
  int local_40 [2];
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  void *pvStack_20;
  undefined8 local_18;
  long lStack_10;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  pvStack_20 = (void *)0x0;
  local_18 = 0;
  lStack_10 = 0;
  *(undefined4 *)((long)local_40 + accessor::Proxy<TestFoo,TestFoo>::value) = 100;
  *(undefined4 *)((long)local_40 + accessor::Proxy<TestFoo2,TestFoo2>::value) = 0x65;
  iVar1 = *(int *)((long)local_40 + accessor::Proxy<TestFoo,TestFoo>::value);
  if (pvStack_20 != (void *)0x0) {
    operator_delete(pvStack_20,lStack_10 - (long)pvStack_20);
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return iVar1 == 100;
}

Assistant:

bool changeValueOfSimpleMember()
{
  Test t;

  ::accessor::accessMember<TestFoo>(t).get() = 100;
  ::accessor::accessMember<TestFoo2>(t).get() = 101;
  return (::accessor::accessMember<TestFoo>(t) == 100)
      && (::accessor::accessMember<TestFoo2>(t) == 101);
}